

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_test.cpp
# Opt level: O2

void __thiscall HuffmanTest::test_read_buf(HuffmanTest *this,int number)

{
  int iVar1;
  size_t length;
  HuffmanTest *this_00;
  int number_local;
  BitReader in;
  stringstream os;
  HuffmanTest local_180 [47];
  
  number_local = number;
  std::__cxx11::stringstream::stringstream((stringstream *)&os);
  BitReader::BitReader(&in,(istream *)&os);
  this_00 = local_180;
  std::ostream::write((char *)this_00,(long)&number_local);
  length = count_size(this_00,number_local);
  iVar1 = BitReader::read_buf(&in,length);
  Test::check(iVar1 == number_local,"test_read_buf",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/test/huffman_test.cpp"
              ,0x35);
  std::__cxx11::stringstream::~stringstream((stringstream *)&os);
  return;
}

Assistant:

void HuffmanTest::test_read_buf(int number) {
    std::stringstream os;
    BitReader in(os);
    os.write(reinterpret_cast<const char *>(&number), sizeof(int));
    int res = in.read_buf(count_size(number));
    DO_CHECK(res == number);
}